

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<bool> __thiscall
kj::HttpServer::listenHttpCleanDrain(HttpServer *this,AsyncIoStream *connection)

{
  Tag TVar1;
  AsyncIoStream *params;
  RefOrVoid<kj::HttpService> params_2;
  Connection *pCVar2;
  Connection *in_RDX;
  PromiseNode *extraout_RDX;
  Promise<bool> PVar3;
  Promise<bool> local_100;
  PropagateException local_e9;
  Promise<void> local_e8;
  Promise<void> local_d8;
  undefined1 local_c8 [24];
  Promise<bool> promise;
  Own<kj::HttpServer::Connection> local_98;
  undefined1 local_88 [8];
  Own<kj::HttpService> srv;
  Function<kj::Own<kj::HttpService>_(kj::AsyncIoStream_&)> *_kj_switch_done_1;
  Function<kj::Own<kj::HttpService>_(kj::AsyncIoStream_&)> *func;
  HttpService **local_58;
  HttpService **_kj_switch_done;
  HttpService **ptr;
  Header *local_38;
  OneOf<kj::HttpService_*,_kj::Function<kj::Own<kj::HttpService>_(kj::AsyncIoStream_&)>_>
  *_kj_switch_subject;
  Own<kj::HttpServer::Connection> obj;
  AsyncIoStream *connection_local;
  HttpServer *this_local;
  
  obj.ptr = in_RDX;
  Own<kj::HttpServer::Connection>::Own((Own<kj::HttpServer::Connection> *)&_kj_switch_subject);
  local_38 = (Header *)
             OneOf<kj::HttpService_*,_kj::Function<kj::Own<kj::HttpService>_(kj::AsyncIoStream_&)>_>
             ::_switchSubject((OneOf<kj::HttpService_*,_kj::Function<kj::Own<kj::HttpService>_(kj::AsyncIoStream_&)>_>
                               *)&connection[1].super_AsyncOutputStream);
  TVar1 = OneOf<kj::HttpService_*,_kj::Function<kj::Own<kj::HttpService>_(kj::AsyncIoStream_&)>_>::
          which((OneOf<kj::HttpService_*,_kj::Function<kj::Own<kj::HttpService>_(kj::AsyncIoStream_&)>_>
                 *)local_38);
  if (TVar1 == _variant0) {
    local_58 = OneOf<kj::HttpService*,kj::Function<kj::Own<kj::HttpService>(kj::AsyncIoStream&)>>::
               get<kj::HttpService*>
                         ((OneOf<kj::HttpService*,kj::Function<kj::Own<kj::HttpService>(kj::AsyncIoStream&)>>
                           *)local_38);
    _kj_switch_done = local_58;
    while (local_58 != (HttpService **)0x0) {
      heap<kj::HttpServer::Connection,kj::HttpServer&,kj::AsyncIoStream&,kj::HttpService&>
                ((kj *)&func,(HttpServer *)connection,(AsyncIoStream *)obj.ptr,*_kj_switch_done);
      Own<kj::HttpServer::Connection>::operator=
                ((Own<kj::HttpServer::Connection> *)&_kj_switch_subject,
                 (Own<kj::HttpServer::Connection> *)&func);
      Own<kj::HttpServer::Connection>::~Own((Own<kj::HttpServer::Connection> *)&func);
      local_58 = (HttpService **)0x0;
    }
  }
  else if (TVar1 == _variant1) {
    params = (AsyncIoStream *)
             OneOf<kj::HttpService*,kj::Function<kj::Own<kj::HttpService>(kj::AsyncIoStream&)>>::
             get<kj::Function<kj::Own<kj::HttpService>(kj::AsyncIoStream&)>>
                       ((OneOf<kj::HttpService*,kj::Function<kj::Own<kj::HttpService>(kj::AsyncIoStream&)>>
                         *)local_38);
    srv.ptr = (HttpService *)params;
    while (srv.ptr != (HttpService *)0x0) {
      Function<kj::Own<kj::HttpService>_(kj::AsyncIoStream_&)>::operator()
                ((Function<kj::Own<kj::HttpService>_(kj::AsyncIoStream_&)> *)local_88,params);
      pCVar2 = obj.ptr;
      params_2 = Own<kj::HttpService>::operator*((Own<kj::HttpService> *)local_88);
      heap<kj::HttpServer::Connection,kj::HttpServer&,kj::AsyncIoStream&,kj::HttpService&>
                ((kj *)&local_98,(HttpServer *)connection,(AsyncIoStream *)pCVar2,params_2);
      Own<kj::HttpServer::Connection>::operator=
                ((Own<kj::HttpServer::Connection> *)&_kj_switch_subject,&local_98);
      Own<kj::HttpServer::Connection>::~Own(&local_98);
      mv<kj::Own<kj::HttpService>>((Own<kj::HttpService> *)local_88);
      Own<kj::HttpServer::Connection>::attach<kj::Own<kj::HttpService>>
                ((Own<kj::HttpServer::Connection> *)&promise.super_PromiseBase.node.ptr,
                 (Own<kj::HttpService> *)&_kj_switch_subject);
      Own<kj::HttpServer::Connection>::operator=
                ((Own<kj::HttpServer::Connection> *)&_kj_switch_subject,
                 (Own<kj::HttpServer::Connection> *)&promise.super_PromiseBase.node.ptr);
      Own<kj::HttpServer::Connection>::~Own
                ((Own<kj::HttpServer::Connection> *)&promise.super_PromiseBase.node.ptr);
      Own<kj::HttpService>::~Own((Own<kj::HttpService> *)local_88);
      srv.ptr = (HttpService *)0x0;
    }
  }
  pCVar2 = Own<kj::HttpServer::Connection>::operator->
                     ((Own<kj::HttpServer::Connection> *)&_kj_switch_subject);
  PVar3 = Connection::loop((Connection *)local_c8,SUB81(pCVar2,0));
  (**(code **)&(obj.ptr)->server->service)
            (&local_e8,&(obj.ptr)->server,PVar3.super_PromiseBase.node.ptr);
  Promise<void>::
  then<kj::HttpServer::listenHttpCleanDrain(kj::AsyncIoStream&)::__0,kj::_::PropagateException>
            (&local_d8,(Type *)&local_e8,&local_e9);
  Promise<bool>::exclusiveJoin((Promise<bool> *)(local_c8 + 0x10),(Promise<bool> *)local_c8);
  Promise<bool>::~Promise((Promise<bool> *)&local_d8);
  Promise<void>::~Promise(&local_e8);
  Promise<bool>::~Promise((Promise<bool> *)local_c8);
  mv<kj::Own<kj::HttpServer::Connection>>((Own<kj::HttpServer::Connection> *)&_kj_switch_subject);
  Promise<bool>::attach<kj::Own<kj::HttpServer::Connection>>
            (&local_100,(Own<kj::HttpServer::Connection> *)(local_c8 + 0x10));
  Promise<bool>::eagerlyEvaluate((Promise<bool> *)this,&local_100);
  Promise<bool>::~Promise(&local_100);
  Promise<bool>::~Promise((Promise<bool> *)(local_c8 + 0x10));
  Own<kj::HttpServer::Connection>::~Own((Own<kj::HttpServer::Connection> *)&_kj_switch_subject);
  PVar3.super_PromiseBase.node.ptr = extraout_RDX;
  PVar3.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<bool>)PVar3.super_PromiseBase.node;
}

Assistant:

kj::Promise<bool> HttpServer::listenHttpCleanDrain(kj::AsyncIoStream& connection) {
  kj::Own<Connection> obj;

  KJ_SWITCH_ONEOF(service) {
    KJ_CASE_ONEOF(ptr, HttpService*) {
      obj = heap<Connection>(*this, connection, *ptr);
    }
    KJ_CASE_ONEOF(func, HttpServiceFactory) {
      auto srv = func(connection);
      obj = heap<Connection>(*this, connection, *srv);
      obj = obj.attach(kj::mv(srv));
    }
  }

  // Start reading requests and responding to them, but immediately cancel processing if the client
  // disconnects.
  auto promise = obj->loop(true)
      .exclusiveJoin(connection.whenWriteDisconnected().then([]() {return false;}));

  // Eagerly evaluate so that we drop the connection when the promise resolves, even if the caller
  // doesn't eagerly evaluate.
  return promise.attach(kj::mv(obj)).eagerlyEvaluate(nullptr);
}